

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O2

void __thiscall Imf_2_5::CompositeDeepScanLine::Data::check_valid(Data *this,Header *header)

{
  pointer ppDVar1;
  pointer ppDVar2;
  Data *pDVar3;
  bool bVar4;
  ChannelList *pCVar5;
  const_iterator cVar6;
  ConstIterator CVar7;
  undefined7 extraout_var;
  Header *this_00;
  Box2i *pBVar8;
  Box2i *src;
  ArgExc *this_01;
  byte bVar9;
  char *pcVar10;
  allocator<char> local_5d;
  uint local_5c;
  Data *local_58;
  string n;
  
  local_58 = this;
  pCVar5 = Header::channels(header);
  cVar6._M_node = (_Base_ptr)ChannelList::begin(pCVar5);
  bVar9 = 0;
  local_5c = 0;
  while( true ) {
    pCVar5 = Header::channels(header);
    CVar7 = ChannelList::end(pCVar5);
    pDVar3 = local_58;
    if ((const_iterator)cVar6._M_node == CVar7._i._M_node) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&n,(char *)(cVar6._M_node + 1),&local_5d);
    bVar4 = std::operator==(&n,"ZBack");
    if (bVar4) {
      local_58->_zback = true;
    }
    else {
      bVar4 = std::operator==(&n,"Z");
      if (bVar4) {
        local_5c = (uint)CONCAT71(extraout_var,1);
      }
      else {
        bVar4 = std::operator==(&n,"A");
        bVar9 = bVar9 | bVar4;
      }
    }
    std::__cxx11::string::~string((string *)&n);
    cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
  }
  if ((local_5c & 1) == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar10 = "Deep data provided to CompositeDeepScanLine is missing a Z channel";
  }
  else if (bVar9 == 0) {
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar10 = "Deep data provided to CompositeDeepScanLine is missing an alpha channel";
  }
  else {
    ppDVar1 = (local_58->_part).
              super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((local_58->_part).
        super__Vector_base<Imf_2_5::DeepScanLineInputPart_*,_std::allocator<Imf_2_5::DeepScanLineInputPart_*>_>
        ._M_impl.super__Vector_impl_data._M_finish == ppDVar1) {
      ppDVar2 = (local_58->_file).
                super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((local_58->_file).
          super__Vector_base<Imf_2_5::DeepScanLineInputFile_*,_std::allocator<Imf_2_5::DeepScanLineInputFile_*>_>
          ._M_impl.super__Vector_impl_data._M_finish == ppDVar2) {
        pBVar8 = Header::dataWindow(header);
        (pDVar3->_dataWindow).min = pBVar8->min;
        (pDVar3->_dataWindow).max = pBVar8->max;
        return;
      }
      this_00 = DeepScanLineInputFile::header(*ppDVar2);
    }
    else {
      this_00 = DeepScanLineInputPart::header(*ppDVar1);
    }
    pBVar8 = Header::displayWindow(this_00);
    src = Header::displayWindow(header);
    bVar4 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator!=(pBVar8,src);
    if (!bVar4) {
      pBVar8 = Header::dataWindow(header);
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::extendBy(&pDVar3->_dataWindow,pBVar8);
      return;
    }
    this_01 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar10 = 
    "Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data"
    ;
  }
  Iex_2_5::ArgExc::ArgExc(this_01,pcVar10);
  __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
CompositeDeepScanLine::Data::check_valid(const Header & header)
{

    bool has_z=false;
    bool has_alpha=false;
    // check good channel names
    for( ChannelList::ConstIterator i=header.channels().begin();i!=header.channels().end();++i)
    {
        std::string n(i.name()); 
        if(n=="ZBack")
        {
            _zback=true;
        }
        else if(n=="Z")
        {
            has_z=true;
        }
        else if(n=="A")
        {
            has_alpha=true;
        }
    }
    
    if(!has_z)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing a Z channel");
    }
    
    if(!has_alpha)
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine is missing an alpha channel");
    }
    
    
    if(_part.size()==0 && _file.size()==0)
    {
       // first in - update and return

       _dataWindow = header.dataWindow();
       
       return;
    }
    
    
    const Header * const match_header = _part.size()>0 ? &_part[0]->header() : &_file[0]->header();
    
    // check the sizes match
    if(match_header->displayWindow() != header.displayWindow())
    {
        throw IEX_NAMESPACE::ArgExc("Deep data provided to CompositeDeepScanLine has a different displayWindow to previously provided data");
    }
    
    _dataWindow.extendBy(header.dataWindow());
    
}